

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
::find_or_prepare_insert_non_soo<int>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
          *this,int *key)

{
  ctrl_t *pcVar1;
  ulong uVar2;
  uint uVar3;
  ushort uVar4;
  ctrl_t cVar5;
  ctrl_t cVar6;
  ctrl_t cVar7;
  ctrl_t cVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  undefined1 uVar21;
  bool bVar22;
  ushort uVar23;
  ctrl_t *pcVar24;
  slot_type *psVar25;
  uint uVar26;
  ulong uVar27;
  CommonFields *common;
  PolicyFunctions *in_R9;
  size_t cap;
  size_t sVar28;
  ulong uVar29;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  __m128i match;
  undefined1 auVar36 [16];
  iterator iVar37;
  FindInfo target;
  ulong local_78;
  ctrl_t cVar30;
  ctrl_t cVar33;
  ctrl_t cVar34;
  ctrl_t cVar35;
  
  sVar28 = (this->settings_).
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           capacity_;
  if (sVar28 == 1) {
    __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xf66,
                  "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, double>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, double>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<int, double>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, double>>, K = int]"
                 );
  }
  if (sVar28 != 0) {
    prefetch_heap_block(this);
    uVar2 = (this->settings_).
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            capacity_;
    if ((uVar2 + 1 & uVar2) != 0) {
      __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x14c,
                    "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                   );
    }
    uVar27 = ((ulong)(uint)*key ^ (ulong)&hash_internal::MixingHashState::kSeed) *
             -0x234dd359734ecb13;
    common = (CommonFields *)
             (uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 |
              (uVar27 & 0xff0000000000) >> 0x18 | (uVar27 & 0xff00000000) >> 8 |
              (uVar27 & 0xff000000) << 8 | (uVar27 & 0xff0000) << 0x18 | (uVar27 & 0xff00) << 0x28 |
             uVar27 << 0x38);
    uVar29 = (ulong)common >> 7 ^
             (ulong)(this->settings_).
                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                    .value.heap_or_soo_.heap.control >> 0xc;
    pcVar24 = control(this);
    uVar21 = (undefined1)(uVar27 >> 0x38);
    auVar31 = ZEXT216(CONCAT11(uVar21,uVar21) & 0x7f7f);
    auVar31 = pshuflw(auVar31,auVar31,0);
    local_78 = 0;
    while( true ) {
      uVar29 = uVar29 & uVar2;
      pcVar1 = pcVar24 + uVar29;
      cVar5 = *pcVar1;
      cVar6 = pcVar1[1];
      cVar7 = pcVar1[2];
      cVar8 = pcVar1[3];
      cVar9 = pcVar1[4];
      cVar10 = pcVar1[5];
      cVar11 = pcVar1[6];
      cVar12 = pcVar1[7];
      cVar13 = pcVar1[8];
      cVar14 = pcVar1[9];
      cVar15 = pcVar1[10];
      cVar16 = pcVar1[0xb];
      cVar17 = pcVar1[0xc];
      cVar18 = pcVar1[0xd];
      cVar19 = pcVar1[0xe];
      cVar20 = pcVar1[0xf];
      cVar30 = auVar31[0];
      auVar32[0] = -(cVar30 == cVar5);
      cVar33 = auVar31[1];
      auVar32[1] = -(cVar33 == cVar6);
      cVar34 = auVar31[2];
      auVar32[2] = -(cVar34 == cVar7);
      cVar35 = auVar31[3];
      auVar32[3] = -(cVar35 == cVar8);
      auVar32[4] = -(cVar30 == cVar9);
      auVar32[5] = -(cVar33 == cVar10);
      auVar32[6] = -(cVar34 == cVar11);
      auVar32[7] = -(cVar35 == cVar12);
      auVar32[8] = -(cVar30 == cVar13);
      auVar32[9] = -(cVar33 == cVar14);
      auVar32[10] = -(cVar34 == cVar15);
      auVar32[0xb] = -(cVar35 == cVar16);
      auVar32[0xc] = -(cVar30 == cVar17);
      auVar32[0xd] = -(cVar33 == cVar18);
      auVar32[0xe] = -(cVar34 == cVar19);
      auVar32[0xf] = -(cVar35 == cVar20);
      uVar23 = (ushort)(SUB161(auVar32 >> 7,0) & 1) | (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe | (ushort)(auVar32[0xf] >> 7) << 0xf;
      uVar26 = (uint)uVar23;
      while (uVar23 != 0) {
        uVar3 = 0;
        if (uVar26 != 0) {
          for (; (uVar26 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        psVar25 = slot_array(this);
        sVar28 = uVar3 + uVar29 & uVar2;
        if (psVar25[sVar28].value.first == *key) {
          bVar22 = false;
          goto LAB_001b01b3;
        }
        uVar23 = (ushort)(uVar26 - 1) & (ushort)uVar26;
        uVar26 = CONCAT22((short)(uVar26 - 1 >> 0x10),uVar23);
      }
      auVar36[0] = -(cVar5 == kEmpty);
      auVar36[1] = -(cVar6 == kEmpty);
      auVar36[2] = -(cVar7 == kEmpty);
      auVar36[3] = -(cVar8 == kEmpty);
      auVar36[4] = -(cVar9 == kEmpty);
      auVar36[5] = -(cVar10 == kEmpty);
      auVar36[6] = -(cVar11 == kEmpty);
      auVar36[7] = -(cVar12 == kEmpty);
      auVar36[8] = -(cVar13 == kEmpty);
      auVar36[9] = -(cVar14 == kEmpty);
      auVar36[10] = -(cVar15 == kEmpty);
      auVar36[0xb] = -(cVar16 == kEmpty);
      auVar36[0xc] = -(cVar17 == kEmpty);
      auVar36[0xd] = -(cVar18 == kEmpty);
      auVar36[0xe] = -(cVar19 == kEmpty);
      auVar36[0xf] = -(cVar20 == kEmpty);
      uVar23 = (ushort)(SUB161(auVar36 >> 7,0) & 1) | (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe | (ushort)(auVar36[0xf] >> 7) << 0xf;
      sVar28 = (this->settings_).
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.capacity_;
      if (uVar23 != 0) break;
      if (sVar28 == 0) goto LAB_001b01df;
      uVar29 = uVar29 + local_78 + 0x10;
      local_78 = local_78 + 0x10;
      if (sVar28 < local_78) {
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf7d,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, double>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, double>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<int, double>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, double>>, K = int]"
                     );
      }
    }
    if (sVar28 != 0) {
      pcVar24 = control(this);
      bVar22 = ShouldInsertBackwardsForDebug(sVar28,(size_t)common,pcVar24);
      if (bVar22) {
        uVar4 = 0xf;
        if (uVar23 != 0) {
          for (; uVar23 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        uVar26 = (ushort)((uVar4 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar26 = 0;
        if (uVar23 != 0) {
          for (; (uVar23 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
          }
        }
      }
      target.probe_length =
           (size_t)raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,double>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,double>>>
                   ::GetPolicyFunctions()::value;
      target.offset = local_78;
      sVar28 = PrepareInsertNonSoo((container_internal *)this,common,uVar26 + uVar29 & uVar2,target,
                                   in_R9);
      bVar22 = true;
LAB_001b01b3:
      iVar37 = iterator_at(this,sVar28);
      __return_storage_ptr__->first = iVar37;
      __return_storage_ptr__->second = bVar22;
      return __return_storage_ptr__;
    }
  }
LAB_001b01df:
  __assert_fail("cap >= kDefaultCapacity",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xb75,
                "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, double>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, double>>>::capacity() const [Policy = absl::container_internal::FlatHashMapPolicy<int, double>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, double>>]"
               );
}

Assistant:

size_t capacity() const { return capacity_; }